

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

ScenarioUpperBound * __thiscall
despot::BaseTag::CreateScenarioUpperBound(BaseTag *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  ScenarioUpperBound *this_00;
  ParticleUpperBound *pPVar2;
  ostream *poVar3;
  string *this_01;
  string asStack_58 [32];
  string local_38 [32];
  
  this_01 = asStack_58;
  bVar1 = std::operator==(name,"TRIVIAL");
  if (!bVar1) {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"MDP");
      if (!bVar1) {
        bVar1 = std::operator==(name,"SP");
        if (!bVar1) {
          bVar1 = std::operator==(name,"MANHATTAN");
          if (!bVar1) {
            bVar1 = std::operator==(name,"LOOKAHEAD");
            if (!bVar1) {
              bVar1 = std::operator!=(name,"print");
              if (bVar1) {
                poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported upper bound: ");
                poVar3 = std::operator<<(poVar3,(string *)name);
                std::endl<char,std::char_traits<char>>(poVar3);
              }
              poVar3 = std::operator<<((ostream *)&std::cerr,
                                       "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)"
                                      );
              std::endl<char,std::char_traits<char>>(poVar3);
              poVar3 = std::operator<<((ostream *)&std::cerr,"With base upper bound: LOOKAHEAD");
              std::endl<char,std::char_traits<char>>(poVar3);
              exit(1);
            }
            this_00 = (ScenarioUpperBound *)operator_new(0x38);
            std::__cxx11::string::string(asStack_58,(string *)particle_bound_name);
            pPVar2 = (ParticleUpperBound *)(**(code **)(*(long *)this + 0x88))(this,asStack_58);
            despot::LookaheadUpperBound::LookaheadUpperBound
                      ((LookaheadUpperBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP,
                       &this->super_StateIndexer,pPVar2);
            goto LAB_00112449;
          }
        }
      }
    }
  }
  this_01 = local_38;
  std::__cxx11::string::string(this_01,(string *)name);
  this_00 = (ScenarioUpperBound *)(**(code **)(*(long *)this + 0x88))(this,this_01);
LAB_00112449:
  std::__cxx11::string::~string(this_01);
  return this_00;
}

Assistant:

ScenarioUpperBound* BaseTag::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT" || name == "MDP" ||
			name == "SP" || name == "MANHATTAN") {
		return CreateParticleUpperBound(name);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *this,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)" << endl;
		cerr << "With base upper bound: LOOKAHEAD" << endl;
		exit(1);
		return NULL;
	}
}